

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSA.cpp
# Opt level: O1

bool __thiscall OSSLRSA::signUpdate(OSSLRSA *this,ByteString *dataToSign)

{
  HashAlgorithm *pHVar1;
  bool bVar2;
  int iVar3;
  ByteString dummy;
  ByteString local_40;
  
  bVar2 = AsymmetricAlgorithm::signUpdate(&this->super_AsymmetricAlgorithm,dataToSign);
  if (bVar2) {
    iVar3 = (*this->pCurrentHash->_vptr_HashAlgorithm[3])(this->pCurrentHash,dataToSign);
    if ((char)iVar3 == '\0') {
      if (this->pCurrentHash != (HashAlgorithm *)0x0) {
        (*this->pCurrentHash->_vptr_HashAlgorithm[1])();
      }
      this->pCurrentHash = (HashAlgorithm *)0x0;
      ByteString::ByteString(&local_40);
      AsymmetricAlgorithm::signFinal(&this->super_AsymmetricAlgorithm,&local_40);
    }
    else {
      pHVar1 = this->pSecondHash;
      if (pHVar1 == (HashAlgorithm *)0x0) {
        return true;
      }
      iVar3 = (*pHVar1->_vptr_HashAlgorithm[3])(pHVar1,dataToSign);
      if ((char)iVar3 != '\0') {
        return true;
      }
      if (this->pCurrentHash != (HashAlgorithm *)0x0) {
        (*this->pCurrentHash->_vptr_HashAlgorithm[1])();
      }
      this->pCurrentHash = (HashAlgorithm *)0x0;
      if (this->pSecondHash != (HashAlgorithm *)0x0) {
        (*this->pSecondHash->_vptr_HashAlgorithm[1])();
      }
      this->pSecondHash = (HashAlgorithm *)0x0;
      ByteString::ByteString(&local_40);
      AsymmetricAlgorithm::signFinal(&this->super_AsymmetricAlgorithm,&local_40);
    }
    local_40._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_40.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  }
  return false;
}

Assistant:

bool OSSLRSA::signUpdate(const ByteString& dataToSign)
{
	if (!AsymmetricAlgorithm::signUpdate(dataToSign))
	{
		return false;
	}

	if (!pCurrentHash->hashUpdate(dataToSign))
	{
		delete pCurrentHash;
		pCurrentHash = NULL;

		ByteString dummy;
		AsymmetricAlgorithm::signFinal(dummy);

		return false;
	}

	if ((pSecondHash != NULL) && !pSecondHash->hashUpdate(dataToSign))
	{
		delete pCurrentHash;
		pCurrentHash = NULL;

		delete pSecondHash;
		pSecondHash = NULL;

		ByteString dummy;
		AsymmetricAlgorithm::signFinal(dummy);

		return false;
	}

	return true;
}